

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O1

bool P_LoadBuildMap(BYTE *data,size_t len,FMapThing **sprites,int *numspr)

{
  walltype *pwVar1;
  spritetype *psVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  char cVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  BYTE BVar15;
  BYTE BVar16;
  BYTE BVar17;
  BYTE BVar18;
  BYTE BVar19;
  BYTE BVar20;
  BYTE BVar21;
  BYTE BVar22;
  long *plVar23;
  int i;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  sectortype *psVar27;
  walltype *walls;
  spritetype *sprites_00;
  Xsprite *xsprites;
  FMapThing *pFVar28;
  FDoomEdEntry *pFVar29;
  ulong uVar30;
  walltype *pwVar31;
  spritetype *psVar32;
  sectortype *psVar33;
  Xsprite *pXVar34;
  long *plVar35;
  int i_1;
  long lVar36;
  sectortype *psVar37;
  long lVar38;
  ulong uVar39;
  BYTE *pBVar40;
  BYTE *pBVar41;
  bool bVar42;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined3 uStack_50;
  undefined2 uStack_4d;
  undefined2 uStack_4b;
  undefined1 uStack_49;
  undefined1 uStack_48;
  ushort uStack_47;
  ushort uStack_45;
  ulong local_40;
  FMapThing **local_38;
  
  if (len < 0x1a) {
    return false;
  }
  if (*(int *)data == 0x1a4d4c42) {
    bVar3 = data[5];
    bVar42 = (bVar3 & 0xfe) == 6;
    if (!bVar42) {
      return bVar42;
    }
    iVar24 = *(int *)(data + 0x1c);
    if (((iVar24 == 0) || (iVar24 == 0x4d617474)) || (iVar24 == 0x7474614d)) {
      uVar7 = *(undefined8 *)(data + 0x23);
      uStack_48 = (undefined1)((ulong)uVar7 >> 0x18);
      uStack_47 = (ushort)((ulong)uVar7 >> 0x20);
      uStack_45 = (ushort)((ulong)uVar7 >> 0x30);
      local_68 = *(undefined8 *)(data + 6);
      uStack_60 = *(undefined8 *)(data + 0xe);
      local_58 = *(ulong *)(data + 0x16);
      uVar7 = *(undefined8 *)(data + 0x1e);
      uStack_50 = (undefined3)uVar7;
      uStack_4d = (undefined2)((ulong)uVar7 >> 0x18);
      uStack_4b = (undefined2)((ulong)uVar7 >> 0x28);
      uStack_49 = (undefined1)((ulong)uVar7 >> 0x38);
    }
    else {
      lVar36 = 0;
      do {
        *(byte *)((long)&local_68 + lVar36) = (char)lVar36 + 0x4dU ^ data[lVar36 + 6];
        lVar36 = lVar36 + 1;
      } while (lVar36 != 0x25);
    }
    uVar5 = uStack_45;
    uVar4 = uStack_47;
    bVar9 = (byte)local_58 & 0x1f;
    local_40 = (ulong)CONCAT22(uStack_4b,uStack_4d);
    numsectors = (int)CONCAT11(uStack_48,uStack_49);
    uVar25 = (ulong)uStack_47;
    uVar26 = (ulong)uStack_45;
    local_38 = sprites;
    Printf("Visibility: %d\n",local_58 >> 0x10 & 0xffffffff);
    pBVar40 = data + (long)(2 << bVar9) + (ulong)(bVar3 == 7) * 0x80 + 0x2b;
    uVar39 = (ulong)numsectors;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar39;
    uVar30 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x28),8) == 0) {
      uVar30 = SUB168(auVar8 * ZEXT816(0x28),0);
    }
    psVar27 = (sectortype *)operator_new__(uVar30);
    walls = (walltype *)operator_new__((ulong)uVar4 << 5);
    sprites_00 = (spritetype *)operator_new__(uVar26 * 0x2c);
    xsprites = (Xsprite *)operator_new__(uVar26 * 0x38);
    cVar10 = (char)local_40;
    if (0 < (long)uVar39) {
      uVar30 = 0;
      psVar33 = psVar27;
      do {
        if (bVar3 == 7) {
          lVar36 = 0;
          do {
            *(BYTE *)((long)&psVar33->wallptr + lVar36) =
                 cVar10 * '(' + (char)lVar36 ^ pBVar40[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0x28);
        }
        else {
          psVar37 = psVar27 + uVar30;
          uVar7 = *(undefined8 *)(pBVar40 + 0x20);
          psVar37->visibility = (char)uVar7;
          psVar37->filler = (char)((ulong)uVar7 >> 8);
          psVar37->lotag = (short)((ulong)uVar7 >> 0x10);
          psVar37->hitag = (short)((ulong)uVar7 >> 0x20);
          psVar37->extra = (short)((ulong)uVar7 >> 0x30);
          uVar7 = *(undefined8 *)pBVar40;
          uVar11 = *(undefined8 *)(pBVar40 + 8);
          uVar12 = *(undefined8 *)(pBVar40 + 0x10);
          uVar13 = *(undefined8 *)(pBVar40 + 0x18);
          psVar37->ceilingpicnum = (short)uVar12;
          psVar37->ceilingheinum = (short)((ulong)uVar12 >> 0x10);
          psVar37->ceilingshade = (char)((ulong)uVar12 >> 0x20);
          psVar37->ceilingpal = (char)((ulong)uVar12 >> 0x28);
          psVar37->ceilingxpanning = (char)((ulong)uVar12 >> 0x30);
          psVar37->ceilingypanning = (char)((ulong)uVar12 >> 0x38);
          psVar37->floorpicnum = (short)uVar13;
          psVar37->floorheinum = (short)((ulong)uVar13 >> 0x10);
          psVar37->floorshade = (char)((ulong)uVar13 >> 0x20);
          psVar37->floorpal = (char)((ulong)uVar13 >> 0x28);
          psVar37->floorxpanning = (char)((ulong)uVar13 >> 0x30);
          psVar37->floorypanning = (char)((ulong)uVar13 >> 0x38);
          psVar37->wallptr = (short)uVar7;
          psVar37->wallnum = (short)((ulong)uVar7 >> 0x10);
          psVar37->ceilingZ = (int)((ulong)uVar7 >> 0x20);
          psVar37->floorZ = (int)uVar11;
          psVar37->ceilingstat = (short)((ulong)uVar11 >> 0x20);
          psVar37->floorstat = (short)((ulong)uVar11 >> 0x30);
        }
        pBVar41 = pBVar40 + 0x28;
        pBVar40 = pBVar40 + 100;
        if (psVar27[uVar30].extra < 1) {
          pBVar40 = pBVar41;
        }
        uVar30 = uVar30 + 1;
        psVar33 = psVar33 + 1;
      } while (uVar30 != uVar39);
    }
    if (uVar4 != 0) {
      uVar30 = 0;
      pwVar31 = walls;
      do {
        if (bVar3 == 7) {
          lVar36 = 0;
          do {
            *(byte *)((long)&pwVar31->x + lVar36) =
                 (cVar10 * '(' | 0x4dU) + (char)lVar36 ^ pBVar40[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0x20);
        }
        else {
          pwVar1 = walls + uVar30;
          uVar7 = *(undefined8 *)pBVar40;
          uVar11 = *(undefined8 *)(pBVar40 + 8);
          uVar12 = *(undefined8 *)(pBVar40 + 0x10);
          uVar13 = *(undefined8 *)(pBVar40 + 0x18);
          pwVar1->picnum = (short)uVar12;
          pwVar1->overpicnum = (short)((ulong)uVar12 >> 0x10);
          pwVar1->shade = (char)((ulong)uVar12 >> 0x20);
          pwVar1->pal = (char)((ulong)uVar12 >> 0x28);
          pwVar1->xrepeat = (char)((ulong)uVar12 >> 0x30);
          pwVar1->yrepeat = (char)((ulong)uVar12 >> 0x38);
          pwVar1->xpanning = (char)uVar13;
          pwVar1->ypanning = (char)((ulong)uVar13 >> 8);
          pwVar1->lotag = (short)((ulong)uVar13 >> 0x10);
          pwVar1->hitag = (short)((ulong)uVar13 >> 0x20);
          pwVar1->extra = (short)((ulong)uVar13 >> 0x30);
          pwVar1->x = (int)uVar7;
          pwVar1->y = (int)((ulong)uVar7 >> 0x20);
          pwVar1->point2 = (short)uVar11;
          pwVar1->nextwall = (short)((ulong)uVar11 >> 0x10);
          pwVar1->nextsector = (short)((ulong)uVar11 >> 0x20);
          pwVar1->cstat = (short)((ulong)uVar11 >> 0x30);
        }
        pBVar41 = pBVar40 + 0x20;
        pBVar40 = pBVar40 + 0x38;
        if (walls[uVar30].extra < 1) {
          pBVar40 = pBVar41;
        }
        uVar30 = uVar30 + 1;
        pwVar31 = pwVar31 + 1;
      } while (uVar30 != uVar25);
    }
    if (uVar5 != 0) {
      uVar30 = 0;
      psVar32 = sprites_00;
      do {
        if (bVar3 == 7) {
          lVar36 = 0;
          do {
            *(byte *)((long)&psVar32->x + lVar36) =
                 (cVar10 * ',' | 0x4dU) + (char)lVar36 ^ pBVar40[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0x2c);
        }
        else {
          psVar2 = sprites_00 + uVar30;
          uVar7 = *(undefined8 *)pBVar40;
          uVar11 = *(undefined8 *)(pBVar40 + 8);
          BVar15 = pBVar40[0x10];
          BVar16 = pBVar40[0x11];
          BVar17 = pBVar40[0x12];
          BVar18 = pBVar40[0x13];
          BVar19 = pBVar40[0x14];
          BVar20 = pBVar40[0x15];
          BVar21 = pBVar40[0x16];
          BVar22 = pBVar40[0x17];
          uVar12 = *(undefined8 *)(pBVar40 + 0x18);
          uVar13 = *(undefined8 *)(pBVar40 + 0x1c);
          uVar14 = *(undefined8 *)(pBVar40 + 0x24);
          psVar2->ang = (short)uVar13;
          psVar2->owner = (short)((ulong)uVar13 >> 0x10);
          psVar2->xvel = (short)((ulong)uVar13 >> 0x20);
          psVar2->yvel = (short)((ulong)uVar13 >> 0x30);
          psVar2->zvel = (short)uVar14;
          psVar2->lotag = (short)((ulong)uVar14 >> 0x10);
          psVar2->hitag = (short)((ulong)uVar14 >> 0x20);
          psVar2->extra = (short)((ulong)uVar14 >> 0x30);
          psVar2->shade = BVar15;
          psVar2->pal = BVar16;
          psVar2->clipdist = BVar17;
          psVar2->filler = BVar18;
          psVar2->xrepeat = BVar19;
          psVar2->yrepeat = BVar20;
          psVar2->xoffset = BVar21;
          psVar2->yoffset = BVar22;
          psVar2->sectnum = (short)uVar12;
          psVar2->statnum = (short)((ulong)uVar12 >> 0x10);
          psVar2->ang = (short)((ulong)uVar12 >> 0x20);
          psVar2->owner = (short)((ulong)uVar12 >> 0x30);
          psVar2->x = (int)uVar7;
          psVar2->y = (int)((ulong)uVar7 >> 0x20);
          psVar2->z = (int)uVar11;
          psVar2->cstat = (short)((ulong)uVar11 >> 0x20);
          psVar2->picnum = (short)((ulong)uVar11 >> 0x30);
        }
        pBVar41 = pBVar40 + 0x2c;
        pXVar34 = xsprites + uVar30;
        if (sprites_00[uVar30].extra < 1) {
          pXVar34->ThisNeedsToBe56Bytes[4] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[5] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[6] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[7] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[8] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[9] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[10] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0xb] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0xc] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0xd] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0xe] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0xf] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x10] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x11] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x12] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x13] = '\0';
          pXVar34->Data1 = 0;
          pXVar34->Data2 = 0;
          pXVar34->Data3 = 0;
          pXVar34->ThisIsntPaddingEither = 0;
          *(undefined8 *)&pXVar34->field_0x18 = 0;
          pXVar34->NotReallyPadding[0] = '\0';
          pXVar34->NotReallyPadding[1] = '\0';
          pXVar34->NotReallyPadding[2] = '\0';
          pXVar34->NotReallyPadding[3] = '\0';
          pXVar34->NotReallyPadding[4] = '\0';
          pXVar34->NotReallyPadding[5] = '\0';
          pXVar34->NotReallyPadding[6] = '\0';
          pXVar34->NotReallyPadding[7] = '\0';
          pXVar34->NotReallyPadding[8] = '\0';
          pXVar34->NotReallyPadding[9] = '\0';
          pXVar34->NotReallyPadding[10] = '\0';
          pXVar34->NotReallyPadding[0xb] = '\0';
          pXVar34->NotReallyPadding[0xc] = '\0';
          pXVar34->NotReallyPadding[0xd] = '\0';
          pXVar34->NotReallyPadding[0xe] = '\0';
          pXVar34->NotReallyPadding[0xf] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x14] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x15] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x16] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x17] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x18] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x19] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x1a] = '\0';
          pXVar34->ThisNeedsToBe56Bytes[0x1b] = '\0';
        }
        else {
          *(undefined8 *)(pXVar34->ThisNeedsToBe56Bytes + 0x14) = *(undefined8 *)(pBVar40 + 0x5c);
          uVar7 = *(undefined8 *)pBVar41;
          uVar11 = *(undefined8 *)(pBVar40 + 0x34);
          uVar12 = *(undefined8 *)(pBVar40 + 0x3c);
          BVar15 = pBVar40[0x44];
          BVar16 = pBVar40[0x45];
          BVar17 = pBVar40[0x46];
          BVar18 = pBVar40[0x47];
          BVar19 = pBVar40[0x48];
          BVar20 = pBVar40[0x49];
          BVar21 = pBVar40[0x4a];
          BVar22 = pBVar40[0x4b];
          uVar13 = *(undefined8 *)(pBVar40 + 0x54);
          *(undefined8 *)(pXVar34->ThisNeedsToBe56Bytes + 4) = *(undefined8 *)(pBVar40 + 0x4c);
          *(undefined8 *)(pXVar34->ThisNeedsToBe56Bytes + 0xc) = uVar13;
          pXVar34->Data1 = (short)uVar12;
          pXVar34->Data2 = (short)((ulong)uVar12 >> 0x10);
          pXVar34->Data3 = (short)((ulong)uVar12 >> 0x20);
          pXVar34->ThisIsntPaddingEither = (short)((ulong)uVar12 >> 0x30);
          pXVar34->field_0x18 = BVar15;
          pXVar34->field_0x19 = BVar16;
          pXVar34->field_0x1a = BVar17;
          pXVar34->field_0x1b = BVar18;
          pXVar34->ThisNeedsToBe56Bytes[0] = BVar19;
          pXVar34->ThisNeedsToBe56Bytes[1] = BVar20;
          pXVar34->ThisNeedsToBe56Bytes[2] = BVar21;
          pXVar34->ThisNeedsToBe56Bytes[3] = BVar22;
          *(undefined8 *)pXVar34->NotReallyPadding = uVar7;
          *(undefined8 *)(pXVar34->NotReallyPadding + 8) = uVar11;
          pBVar41 = pBVar40 + 100;
        }
        uVar30 = uVar30 + 1;
        psVar32 = psVar32 + 1;
        pBVar40 = pBVar41;
      } while (uVar30 != uVar26);
    }
    LoadSectors(psVar27);
    LoadWalls(walls,(uint)uVar4,psVar27);
    pFVar28 = (FMapThing *)operator_new__((ulong)uVar5 * 0x90);
    *local_38 = pFVar28;
    iVar24 = LoadSprites(sprites_00,xsprites,(uint)uVar5,psVar27,pFVar28);
    *numspr = iVar24;
    operator_delete__(psVar27);
    operator_delete__(walls);
    operator_delete__(sprites_00);
    operator_delete__(xsprites);
    return bVar42;
  }
  uVar30 = (ulong)((uint)*(ushort *)(data + 0x14) * 8);
  if (uVar30 * 5 + 0x1a <= len) {
    if (*(int *)data != 7) {
      return false;
    }
    lVar36 = uVar30 * 5;
    uVar4 = *(ushort *)(data + lVar36 + 0x16);
    lVar38 = (ulong)uVar4 * 0x20;
    if (len < lVar36 + lVar38 + 0x18U) {
      return false;
    }
    if (*(ushort *)(data + 0x10) < 0x800) {
      psVar27 = (sectortype *)(data + 0x16);
      numsectors = (int)*(ushort *)(data + 0x14);
      LoadSectors(psVar27);
      LoadWalls((walltype *)(data + (long)numsectors * 0x28 + 0x18),(uint)uVar4,psVar27);
      lVar36 = (long)numsectors;
      uVar4 = *(ushort *)(data + lVar38 + lVar36 * 0x28 + 0x18);
      pFVar28 = (FMapThing *)operator_new__((ulong)((uint)uVar4 * 0x90) + 0x90);
      *sprites = pFVar28;
      uVar5 = *(ushort *)(data + 0x10);
      iVar24 = *(int *)(data + 4);
      iVar6 = *(int *)(data + 8);
      plVar23 = (long *)((long)((DoomEdMap.Nodes)->Pair).Value.Args +
                        ((ulong)((~DoomEdMap.Size & 1) * 0x30) - 0x1c));
      while ((plVar35 = plVar23, plVar35 != (long *)0x0 && ((long *)*plVar35 != (long *)0x1))) {
        plVar23 = (long *)*plVar35;
        if ((int)plVar35[1] == 1) {
LAB_003e3580:
          pFVar29 = (FDoomEdEntry *)(plVar35 + 2);
          if (plVar35 == (long *)0x0) {
            pFVar29 = (FDoomEdEntry *)0x0;
          }
          pFVar28->thingid = 0;
          (pFVar28->pos).Y = (double)-iVar6 * 0.0625;
          (pFVar28->pos).X = (double)iVar24 * 0.0625;
          pFVar28->angle = (short)((-(uint)uVar5 & 0x7ff) * 0x168 >> 0xb);
          pFVar28->SkillFilter = 0;
          pFVar28->ClassFilter = 0;
          pFVar28->EdNum = 1;
          pFVar28->info = pFVar29;
          pFVar28->flags = 0x1e7;
          pFVar28->health = 0;
          pFVar28->score = 0;
          pFVar28->pitch = 0;
          pFVar28->roll = 0;
          pFVar28->RenderStyle = 0;
          pFVar28->FloatbobPhase = 0;
          pFVar28->special = 0;
          pFVar28->args[0] = 0;
          pFVar28->args[1] = 0;
          pFVar28->args[2] = 0;
          pFVar28->args[3] = 0;
          pFVar28->args[4] = 0;
          *(undefined8 *)&pFVar28->Conversation = 0;
          *(undefined8 *)((long)&pFVar28->Gravity + 4) = 0;
          *(undefined8 *)((long)&pFVar28->Alpha + 4) = 0;
          iVar24 = LoadSprites((spritetype *)(data + lVar38 + lVar36 * 0x28 + 0x1a),(Xsprite *)0x0,
                               (uint)uVar4,psVar27,pFVar28 + 1);
          *numspr = iVar24 + 1;
          return true;
        }
      }
      plVar35 = (long *)0x0;
      goto LAB_003e3580;
    }
  }
  return false;
}

Assistant:

bool P_LoadBuildMap (BYTE *data, size_t len, FMapThing **sprites, int *numspr)
{
	if (len < 26)
	{
		return false;
	}

	// Check for a Blood map.
	if (*(DWORD *)data == MAKE_ID('B','L','M','\x1a'))
	{
		return P_LoadBloodMap (data, len, sprites, numspr);
	}

	const int numsec = LittleShort(*(WORD *)(data + 20));
	int numwalls;
	int numsprites;

	if (len < 26 + numsec*sizeof(sectortype) ||
		(numwalls = LittleShort(*(WORD *)(data + 22 + numsec*sizeof(sectortype))),
			len < 24 + numsec*sizeof(sectortype) + numwalls*sizeof(walltype)) ||
		LittleLong(*(DWORD *)data) != 7 ||
		LittleShort(*(WORD *)(data + 16)) >= 2048)
	{ // Can't possibly be a version 7 BUILD map
		return false;
	}

	numsectors = numsec;
	LoadSectors ((sectortype *)(data + 22));
	LoadWalls ((walltype *)(data + 24 + numsectors*sizeof(sectortype)), numwalls,
		(sectortype *)(data + 22));

	numsprites = *(WORD *)(data + 24 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype));
	*sprites = new FMapThing[numsprites + 1];
	CreateStartSpot ((SDWORD *)(data + 4), *sprites);
	*numspr = 1 + LoadSprites ((spritetype *)(data + 26 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype)),
		NULL, numsprites, (sectortype *)(data + 22), *sprites + 1);

	return true;
}